

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_rawset(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *n;
  SQVM *this;
  SQRESULT SVar3;
  SQVM *in_RDI;
  SQObjectPtr *key;
  SQObjectPtr *self;
  bool in_stack_0000009f;
  SQObjectPtr *in_stack_000000a0;
  SQObjectPtr *in_stack_000000a8;
  SQSharedState *in_stack_000000b0;
  SQClass *in_stack_000000b8;
  SQChar *in_stack_ffffffffffffff78;
  SQVM *in_stack_ffffffffffffff80;
  SQInteger in_stack_ffffffffffffff88;
  SQVM *in_stack_ffffffffffffff90;
  SQTable *in_stack_ffffffffffffff98;
  SQVM *in_stack_ffffffffffffffa0;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQInstance *in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQVM *in_stack_ffffffffffffffc8;
  
  n = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  this = (SQVM *)SQVM::GetUp(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  if (*(SQObjectType *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == OT_NULL
     ) {
    SQVM::Pop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    SVar3 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    return SVar3;
  }
  SVar1 = (n->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    in_stack_ffffffffffffff80 = in_RDI;
    SQVM::GetUp(in_RDI,(SQInteger)in_stack_ffffffffffffff78);
    bVar2 = SQVM::Set(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      (SQObjectPtr *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      (SQInteger)in_stack_ffffffffffffffa8);
    if (bVar2) {
      SQVM::Pop(this,(SQInteger)n);
      return 0;
    }
  }
  else {
    if (SVar1 == OT_CLASS) {
      SQVM::GetUp(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
      SQClass::NewSlot(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                       in_stack_0000009f);
      SQVM::Pop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      return 0;
    }
    if (SVar1 == OT_TABLE) {
      SQVM::GetUp(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
      SQTable::NewSlot((SQTable *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                       in_stack_ffffffffffffffa8);
      SQVM::Pop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      return 0;
    }
    if (SVar1 != OT_INSTANCE) {
      SQVM::Pop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      SVar3 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      return SVar3;
    }
    in_stack_ffffffffffffff98 = (n->super_SQObject)._unVal.pTable;
    SQVM::GetUp(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
    bVar2 = SQInstance::Set(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa0 = this;
    if (bVar2) {
      SQVM::Pop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      return 0;
    }
  }
  SQVM::GetUp(in_stack_ffffffffffffff80,(SQInteger)in_RDI);
  SQVM::Raise_IdxError(in_stack_ffffffffffffffa0,(SQObjectPtr *)in_stack_ffffffffffffff98);
  return -1;
}

Assistant:

SQRESULT sq_rawset(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self = stack_get(v, idx);
    SQObjectPtr &key = v->GetUp(-2);
    if(type(key) == OT_NULL) {
        v->Pop(2);
        return sq_throwerror(v, _SC("null key"));
    }
    switch(type(self)) {
    case OT_TABLE:
        _table(self)->NewSlot(key, v->GetUp(-1));
        v->Pop(2);
        return SQ_OK;
    break;
    case OT_CLASS:
        _class(self)->NewSlot(_ss(v), key, v->GetUp(-1),false);
        v->Pop(2);
        return SQ_OK;
    break;
    case OT_INSTANCE:
        if(_instance(self)->Set(key, v->GetUp(-1))) {
            v->Pop(2);
            return SQ_OK;
        }
    break;
    case OT_ARRAY:
        if(v->Set(self, key, v->GetUp(-1),false)) {
            v->Pop(2);
            return SQ_OK;
        }
    break;
    default:
        v->Pop(2);
        return sq_throwerror(v, _SC("rawset works only on array/table/class and instance"));
    }
    v->Raise_IdxError(v->GetUp(-2));return SQ_ERROR;
}